

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  uint uVar2;
  sqlite3_value *psVar3;
  Mem *pMVar4;
  u32 N;
  char *zIn;
  long lVar5;
  long in_FS_OFFSET;
  JsonString jx;
  JsonString local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c0,0xaa,0x88);
  if ((argc & 1U) == 0) {
    local_c0.zBuf = local_c0.zSpace;
    local_c0.nAlloc = 100;
    local_c0.bStatic = '\x01';
    local_c0.eErr = '\0';
    local_c0.nUsed = 1;
    local_c0.zSpace[0] = '{';
    local_c0.pCtx = ctx;
    if (0 < argc) {
      lVar5 = 0;
      do {
        psVar3 = argv[lVar5];
        uVar2._0_2_ = psVar3->flags;
        uVar2._2_1_ = psVar3->enc;
        uVar2._3_1_ = psVar3->eSubtype;
        if ((0x4000000040004U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          ctx->isError = 1;
          sqlite3VdbeMemSetStr
                    (ctx->pOut,"json_object() labels must be TEXT",-1,'\x01',
                     (_func_void_void_ptr *)0xffffffffffffffff);
          if (local_c0.bStatic == '\0') {
            if (*(ulong *)(local_c0.zBuf + -8) < 2) {
              sqlite3_free(local_c0.zBuf + -8);
            }
            else {
              *(ulong *)(local_c0.zBuf + -8) = *(ulong *)(local_c0.zBuf + -8) - 1;
            }
          }
          local_c0.zBuf = local_c0.zSpace;
          local_c0.nAlloc = 100;
          local_c0.nUsed = 0;
          local_c0.bStatic = '\x01';
          goto LAB_001b9605;
        }
        jsonAppendSeparator(&local_c0);
        zIn = (char *)sqlite3ValueText(argv[lVar5],'\x01');
        N = sqlite3ValueBytes(argv[lVar5],'\x01');
        jsonAppendString(&local_c0,zIn,N);
        if (local_c0.nUsed < local_c0.nAlloc) {
          local_c0.zBuf[local_c0.nUsed] = ':';
          local_c0.nUsed = local_c0.nUsed + 1;
        }
        else {
          jsonAppendCharExpand(&local_c0,':');
        }
        jsonAppendSqlValue(&local_c0,argv[lVar5 + 1]);
        lVar5 = lVar5 + 2;
      } while ((int)lVar5 < argc);
    }
    if (local_c0.nUsed < local_c0.nAlloc) {
      local_c0.zBuf[local_c0.nUsed] = '}';
      local_c0.nUsed = local_c0.nUsed + 1;
    }
    else {
      jsonAppendCharExpand(&local_c0,'}');
    }
    jsonReturnString(&local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
    pMVar4 = ctx->pOut;
    pMVar4->eSubtype = 'J';
    pbVar1 = (byte *)((long)&pMVar4->flags + 1);
    *pbVar1 = *pbVar1 | 8;
LAB_001b9605:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    ctx->isError = 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3VdbeMemSetStr
                (ctx->pOut,"json_object() requires an even number of arguments",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonStringInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonStringReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendSqlValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonReturnString(&jx, 0, 0);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}